

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# huf_compress.c
# Opt level: O2

size_t HUF_compress_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,uint huffLog
                 ,uint singleStream,void *workSpace,size_t wkspSize,HUF_CElt *oldHufTable,
                 HUF_repeat *repeat,int preferRepeat,int bmi2)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  HUF_repeat HVar6;
  size_t sVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  BYTE *pBVar11;
  ulong uVar12;
  HUF_CElt *pHVar13;
  uint maxSymbolValue_local;
  HUF_CElt *local_48;
  ulong local_40;
  BYTE *local_38;
  
  if (((ulong)workSpace & 3) != 0) {
    return 0xffffffffffffffff;
  }
  if (wkspSize < 0x1800) {
    return 0xffffffffffffffbe;
  }
  if (dstSize == 0 || srcSize == 0) {
    return 0;
  }
  if (0x20000 < srcSize) {
    return 0xffffffffffffffb8;
  }
  if (0xc < huffLog) {
    return 0xffffffffffffffd4;
  }
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  maxSymbolValue_local = maxSymbolValue;
  if (maxSymbolValue == 0) {
    maxSymbolValue_local = 0xff;
  }
  local_38 = (BYTE *)((long)dst + dstSize);
  uVar5 = 0xb;
  if (huffLog != 0) {
    uVar5 = huffLog;
  }
  if ((repeat != (HUF_repeat *)0x0 && preferRepeat != 0) && (*repeat == HUF_repeat_valid)) {
    sVar7 = HUF_compressCTable_internal
                      ((BYTE *)dst,(BYTE *)dst,local_38,src,srcSize,singleStream,oldHufTable,bmi2);
    return sVar7;
  }
  local_40 = CONCAT71(local_40._1_7_,repeat == (HUF_repeat *)0x0 || preferRepeat == 0);
  local_48 = (HUF_CElt *)CONCAT44(local_48._4_4_,uVar5);
  sVar7 = FSE_count_wksp((uint *)workSpace,&maxSymbolValue_local,src,srcSize,(uint *)workSpace);
  if (0xffffffffffffff88 < sVar7) {
    return sVar7;
  }
  if (sVar7 == srcSize) {
    *(undefined1 *)dst = *src;
    return 1;
  }
  uVar5 = 0;
  if (sVar7 <= (srcSize >> 7) + 1) {
    return 0;
  }
  lVar9 = 0;
  uVar10 = 0;
  for (uVar12 = 0; maxSymbolValue_local != uVar12; uVar12 = uVar12 + 1) {
    uVar2 = *(uint *)((long)workSpace + uVar12 * 4);
    if ((ulong)uVar2 != 0) {
      uVar10 = uVar10 + uVar2;
      uVar5 = uVar5 + 1;
      uVar4 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar4 == 0; uVar4 = uVar4 - 1) {
        }
      }
      lVar9 = lVar9 + (ulong)(((uVar4 ^ 0xffffffe0) + 0x21) * uVar2);
    }
  }
  bVar3 = uVar10 >> 0x20 != 0;
  uVar2 = (uint)(uVar10 >> 0x20);
  if (!bVar3) {
    uVar2 = (uint)uVar10;
  }
  uVar4 = 0x1f;
  if (uVar2 != 0) {
    for (; uVar2 >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  if (srcSize < (uVar5 >> (2U - (uVar5 < 0x41) & 0x1f)) +
                (int)((((uint)bVar3 * 0x20 - (uVar4 ^ 0x1f)) + 0x20) * uVar10 - lVar9 >> 3)) {
    return 0;
  }
  pBVar11 = (BYTE *)dst;
  pHVar13 = oldHufTable;
  if (repeat != (HUF_repeat *)0x0) {
    HVar6 = *repeat;
    if (HVar6 == HUF_repeat_check) {
      uVar5 = 0xffffffff;
      if (-1 < (int)maxSymbolValue_local) {
        uVar5 = maxSymbolValue_local;
      }
      bVar3 = false;
      for (lVar9 = 0; (long)(int)uVar5 + 1 != lVar9; lVar9 = lVar9 + 1) {
        bVar3 = (bool)(bVar3 | (oldHufTable[lVar9].nbBits == '\0' &&
                               *(int *)((long)workSpace + lVar9 * 4) != 0));
      }
      bVar1 = (byte)local_40;
      if (bVar3) {
        *repeat = HUF_repeat_none;
        HVar6 = HUF_repeat_none;
        goto LAB_00168677;
      }
    }
    else {
LAB_00168677:
      bVar1 = (byte)local_40 | HVar6 == HUF_repeat_none;
      local_40 = CONCAT71(local_40._1_7_,bVar1);
    }
    if (bVar1 == 0) goto LAB_001687b2;
  }
  uVar5 = HUF_optimalTableLog((uint)local_48,srcSize,maxSymbolValue_local);
  local_48 = (HUF_CElt *)((long)workSpace + 0x400);
  local_40 = (ulong)maxSymbolValue_local;
  sVar7 = HUF_buildCTable_wksp
                    (local_48,(U32 *)workSpace,maxSymbolValue_local,uVar5,
                     (void *)((long)workSpace + 0x800),0x1000);
  if (0xffffffffffffff88 < sVar7) {
    return sVar7;
  }
  uVar10 = (ulong)((int)local_40 + 1);
  memset(local_48 + uVar10,0,uVar10 * -4 + 0x400);
  sVar7 = HUF_writeCTable(dst,dstSize,local_48,(U32)local_40,(U32)sVar7);
  uVar5 = maxSymbolValue_local;
  if (0xffffffffffffff88 < sVar7) {
    return sVar7;
  }
  if (repeat == (HUF_repeat *)0x0) {
    if (srcSize <= sVar7 + 0xc) {
      return 0;
    }
  }
  else {
    if (*repeat != HUF_repeat_none) {
      local_40 = HUF_estimateCompressedSize(oldHufTable,(uint *)workSpace,maxSymbolValue_local);
      sVar8 = HUF_estimateCompressedSize(local_48,(uint *)workSpace,uVar5);
      if ((srcSize <= sVar7 + 0xc) || (local_40 <= sVar8 + sVar7)) goto LAB_001687b2;
    }
    if (srcSize <= sVar7 + 0xc) {
      return 0;
    }
    *repeat = HUF_repeat_none;
  }
  pBVar11 = (BYTE *)(sVar7 + (long)dst);
  pHVar13 = local_48;
  if (oldHufTable != (HUF_CElt *)0x0) {
    memcpy(oldHufTable,local_48,0x400);
    pHVar13 = local_48;
  }
LAB_001687b2:
  sVar7 = HUF_compressCTable_internal
                    ((BYTE *)dst,pBVar11,local_38,src,srcSize,singleStream,pHVar13,bmi2);
  return sVar7;
}

Assistant:

static size_t HUF_compress_internal (
                void* dst, size_t dstSize,
                const void* src, size_t srcSize,
                unsigned maxSymbolValue, unsigned huffLog,
                unsigned singleStream,
                void* workSpace, size_t wkspSize,
                HUF_CElt* oldHufTable, HUF_repeat* repeat, int preferRepeat,
                const int bmi2)
{
    HUF_compress_tables_t* const table = (HUF_compress_tables_t*)workSpace;
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    /* checks & inits */
    if (((size_t)workSpace & 3) != 0) return ERROR(GENERIC);  /* must be aligned on 4-bytes boundaries */
    if (wkspSize < sizeof(*table)) return ERROR(workSpace_tooSmall);
    if (!srcSize) return 0;  /* Uncompressed */
    if (!dstSize) return 0;  /* cannot fit anything within dst budget */
    if (srcSize > HUF_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);   /* current block size limit */
    if (huffLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    if (!maxSymbolValue) maxSymbolValue = HUF_SYMBOLVALUE_MAX;
    if (!huffLog) huffLog = HUF_TABLELOG_DEFAULT;

    /* Heuristic : If old table is valid, use it for small inputs */
    if (preferRepeat && repeat && *repeat == HUF_repeat_valid) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           singleStream, oldHufTable, bmi2);
    }

    /* Scan input and build symbol stats */
    {  CHECK_V_F(largest, FSE_count_wksp (table->count, &maxSymbolValue, (const BYTE*)src, srcSize, table->count) );
        if (largest == srcSize) { *ostart = ((const BYTE*)src)[0]; return 1; }   /* single symbol, rle */
        if (largest <= (srcSize >> 7) + 1) {
            return 0;   /* heuristic : probably not compressible enough */
        }

        /* Added this more accurate heuristic to handle high entropy data properly -catid */
        U64 total = 0;
        U64 sum_clogc = 0;
        unsigned nonzero_count = 0;
        for (unsigned i = 0; i < maxSymbolValue; ++i) {
            U32 const c_i = table->count[i];
            if (c_i == 0) {
                continue;
            }
            total += c_i;
            ++nonzero_count;
            unsigned const c_bits = BIT_highbit32(c_i) + 1;
            sum_clogc += c_i * c_bits;
        }
        unsigned t_bits = 0;
        U32 t_bits_input = (U32)total;
        if (total >= 0x100000000ULL) {
            t_bits = 32;
            t_bits_input = (U32)(total >> 32);
        }
        t_bits += BIT_highbit32(t_bits_input) + 1;
        unsigned estimate_bytes = (unsigned)((total * t_bits - sum_clogc) / 8);
        if (nonzero_count > 64) {
            estimate_bytes += nonzero_count / 4;
        }
        else {
            estimate_bytes += nonzero_count / 2;
        }
        if (estimate_bytes > srcSize) {
            return 0;   /* heuristic : probably not compressible enough */
        }
    }

    /* Check validity of previous table */
    if ( repeat
      && *repeat == HUF_repeat_check
      && !HUF_validateCTable(oldHufTable, table->count, maxSymbolValue)) {
        *repeat = HUF_repeat_none;
    }
    /* Heuristic : use existing table for small inputs */
    if (preferRepeat && repeat && *repeat != HUF_repeat_none) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           singleStream, oldHufTable, bmi2);
    }

    /* Build Huffman Tree */
    huffLog = HUF_optimalTableLog(huffLog, srcSize, maxSymbolValue);
    {   CHECK_V_F(maxBits, HUF_buildCTable_wksp(table->CTable, table->count,
                                                maxSymbolValue, huffLog,
                                                table->nodeTable, sizeof(table->nodeTable)) );
        huffLog = (U32)maxBits;
        /* Zero unused symbols in CTable, so we can check it for validity */
        memset(table->CTable + (maxSymbolValue + 1), 0,
               sizeof(table->CTable) - ((maxSymbolValue + 1) * sizeof(HUF_CElt)));
    }

    /* Write table description header */
    {   CHECK_V_F(hSize, HUF_writeCTable (op, dstSize, table->CTable, maxSymbolValue, huffLog) );
        /* Check if using previous huffman table is beneficial */
        if (repeat && *repeat != HUF_repeat_none) {
            size_t const oldSize = HUF_estimateCompressedSize(oldHufTable, table->count, maxSymbolValue);
            size_t const newSize = HUF_estimateCompressedSize(table->CTable, table->count, maxSymbolValue);
            if (oldSize <= hSize + newSize || hSize + 12 >= srcSize) {
                return HUF_compressCTable_internal(ostart, op, oend,
                                                   src, srcSize,
                                                   singleStream, oldHufTable, bmi2);
        }   }

        /* Use the new huffman table */
        if (hSize + 12ul >= srcSize) { return 0; }
        op += hSize;
        if (repeat) { *repeat = HUF_repeat_none; }
        if (oldHufTable)
            memcpy(oldHufTable, table->CTable, sizeof(table->CTable));  /* Save new table */
    }
    return HUF_compressCTable_internal(ostart, op, oend,
                                       src, srcSize,
                                       singleStream, table->CTable, bmi2);
}